

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite2_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite2_Test<absl::lts_20250127::Cord> *this)

{
  undefined1 local_c0 [8];
  TypeParam extensions_data;
  TestAllExtensionsLite message3;
  undefined1 local_70 [8];
  TestAllExtensionsLite message2;
  TestAllExtensionsLite message;
  LiteTest_AllLite2_Test<absl::lts_20250127::Cord> *this_local;
  
  proto2_unittest::TestAllExtensionsLite::TestAllExtensionsLite
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensionsLite::TestAllExtensionsLite((TestAllExtensionsLite *)local_70);
  proto2_unittest::TestAllExtensionsLite::TestAllExtensionsLite
            ((TestAllExtensionsLite *)((long)&extensions_data.contents_.data_.rep_.field_0 + 8));
  TestUtilLite::ExpectExtensionsClear
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  TestUtilLite::SetAllExtensions((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensionsLite::operator=
            ((TestAllExtensionsLite *)local_70,
             (TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  SerializeAs<absl::lts_20250127::Cord>((MessageLite *)local_c0);
  ParseFrom((Cord *)local_c0,
            (MessageLite *)((long)&extensions_data.contents_.data_.rep_.field_0 + 8));
  TestUtilLite::ExpectAllExtensionsSet
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  TestUtilLite::ExpectAllExtensionsSet((TestAllExtensionsLite *)local_70);
  TestUtilLite::ExpectAllExtensionsSet
            ((TestAllExtensionsLite *)((long)&extensions_data.contents_.data_.rep_.field_0 + 8));
  TestUtilLite::ModifyRepeatedExtensions
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  TestUtilLite::ExpectRepeatedExtensionsModified
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensionsLite::Clear
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  TestUtilLite::ExpectExtensionsClear
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  absl::lts_20250127::Cord::~Cord((Cord *)local_c0);
  proto2_unittest::TestAllExtensionsLite::~TestAllExtensionsLite
            ((TestAllExtensionsLite *)((long)&extensions_data.contents_.data_.rep_.field_0 + 8));
  proto2_unittest::TestAllExtensionsLite::~TestAllExtensionsLite((TestAllExtensionsLite *)local_70);
  proto2_unittest::TestAllExtensionsLite::~TestAllExtensionsLite
            ((TestAllExtensionsLite *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite2) {
  {
    proto2_unittest::TestAllExtensionsLite message, message2, message3;
    TestUtilLite::ExpectExtensionsClear(message);
    TestUtilLite::SetAllExtensions(&message);
    message2 = message;
    TypeParam extensions_data = SerializeAs<TypeParam>(message);
    ParseFrom(extensions_data, message3);
    TestUtilLite::ExpectAllExtensionsSet(message);
    TestUtilLite::ExpectAllExtensionsSet(message2);
    TestUtilLite::ExpectAllExtensionsSet(message3);
    TestUtilLite::ModifyRepeatedExtensions(&message);
    TestUtilLite::ExpectRepeatedExtensionsModified(message);
    message.Clear();
    TestUtilLite::ExpectExtensionsClear(message);
  }
}